

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O3

DescriptorFlags __thiscall
Js::GlobalObject::GetSetter
          (GlobalObject *this,JavascriptString *propertyNameString,Var *setterValue,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  DescriptorFlags DVar1;
  PropertyRecord *in_RAX;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  
  local_38 = in_RAX;
  ScriptContext::GetOrAddPropertyRecord
            ((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type.ptr)->
               javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
             propertyNameString,&local_38);
  DVar1 = GetSetter(this,local_38->pid,setterValue,info,requestContext);
  return DVar1;
}

Assistant:

DescriptorFlags GlobalObject::GetSetter(JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return GlobalObject::GetSetter(propertyRecord->GetPropertyId(), setterValue, info, requestContext);
    }